

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::ListFieldsMayFailOnStripped
          (Reflection *this,Message *message,bool should_fail,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  uint uVar1;
  uint32_t *this_00;
  bool bVar2;
  int iVar3;
  OneofDescriptor *this_01;
  uint *puVar4;
  char *pcVar5;
  ExtensionSet *this_02;
  iterator iVar6;
  iterator iVar7;
  int __c;
  uint32_t *local_80;
  uint32_t *oneof_case_array;
  OneofDescriptor *containing_oneof;
  FieldDescriptor *field;
  int i;
  int last_non_weak_field_index;
  uint32_t *has_bits_indices;
  uint32_t *has_bits;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *output_local;
  Message *pMStack_18;
  bool should_fail_local;
  Message *message_local;
  Reflection *this_local;
  
  has_bits = (uint32_t *)output;
  output_local._7_1_ = should_fail;
  pMStack_18 = message;
  message_local = (Message *)this;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear(output);
  bVar2 = internal::ReflectionSchema::IsDefaultInstance(&this->schema_,pMStack_18);
  if (!bVar2) {
    bVar2 = internal::ReflectionSchema::HasHasbits(&this->schema_);
    if (bVar2) {
      local_80 = GetHasBits(this,pMStack_18);
    }
    else {
      local_80 = (uint32_t *)0x0;
    }
    this_00 = has_bits;
    has_bits_indices = local_80;
    _i = (this->schema_).has_bit_indices_;
    iVar3 = Descriptor::field_count(this->descriptor_);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)this_00,(long)iVar3);
    field._4_4_ = this->last_non_weak_field_index_;
    for (field._0_4_ = 0; (int)field <= field._4_4_; field._0_4_ = (int)field + 1) {
      containing_oneof = (OneofDescriptor *)Descriptor::field(this->descriptor_,(int)field);
      if (((output_local._7_1_ & 1) != 0) ||
         (bVar2 = internal::ReflectionSchema::IsFieldStripped
                            (&this->schema_,(FieldDescriptor *)containing_oneof), !bVar2)) {
        bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)containing_oneof);
        if (bVar2) {
          iVar3 = FieldSize(this,pMStack_18,(FieldDescriptor *)containing_oneof);
          if (0 < iVar3) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)has_bits,(value_type *)&containing_oneof);
          }
        }
        else {
          this_01 = FieldDescriptor::containing_oneof((FieldDescriptor *)containing_oneof);
          bVar2 = internal::ReflectionSchema::InRealOneof
                            (&this->schema_,(FieldDescriptor *)containing_oneof);
          if (bVar2) {
            uVar1 = (this->schema_).oneof_case_offset_;
            pcVar5 = (char *)(ulong)uVar1;
            puVar4 = internal::GetConstPointerAtOffset<unsigned_int>(pMStack_18,uVar1);
            pcVar5 = OneofDescriptor::index(this_01,pcVar5,__c);
            uVar1 = puVar4[(int)pcVar5];
            iVar3 = FieldDescriptor::number((FieldDescriptor *)containing_oneof);
            if ((ulong)uVar1 == (long)iVar3) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)has_bits,(value_type *)&containing_oneof);
            }
          }
          else if ((has_bits_indices == (uint32_t *)0x0) || (_i[(int)field] == 0xffffffff)) {
            bVar2 = HasBit(this,pMStack_18,(FieldDescriptor *)containing_oneof);
            if (bVar2) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)has_bits,(value_type *)&containing_oneof);
            }
          }
          else {
            anon_unknown_0::CheckInvalidAccess(&this->schema_,(FieldDescriptor *)containing_oneof);
            bVar2 = anon_unknown_0::IsIndexInHasBitSet(has_bits_indices,_i[(int)field]);
            if (bVar2) {
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)has_bits,(value_type *)&containing_oneof);
            }
          }
        }
      }
    }
    bVar2 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
    if (bVar2) {
      this_02 = GetExtensionSet(this,pMStack_18);
      internal::ExtensionSet::AppendToList
                (this_02,this->descriptor_,this->descriptor_pool_,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)has_bits);
    }
    iVar6 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)has_bits);
    iVar7 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)has_bits);
    std::
    sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::(anonymous_namespace)::FieldNumberSorter>
              (iVar6._M_current,iVar7._M_current);
  }
  return;
}

Assistant:

void Reflection::ListFieldsMayFailOnStripped(
    const Message& message, bool should_fail,
    std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticeable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32_t* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32_t* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  const int last_non_weak_field_index = last_non_weak_field_index_;
  for (int i = 0; i <= last_non_weak_field_index; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (!should_fail && schema_.IsFieldStripped(field)) {
      continue;
    }
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (schema_.InRealOneof(field)) {
        const uint32_t* const oneof_case_array =
            GetConstPointerAtOffset<uint32_t>(&message,
                                              schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (static_cast<int64_t>(oneof_case_array[containing_oneof->index()]) ==
            field->number()) {
          output->push_back(field);
        }
      } else if (has_bits && has_bits_indices[i] != static_cast<uint32_t>(-1)) {
        CheckInvalidAccess(schema_, field);
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}